

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall cmTarget::HandleLocationPropertyPolicy(cmTarget *this,cmMakefile *context)

{
  bool bVar1;
  PolicyStatus PVar2;
  size_t sVar3;
  ostream *poVar4;
  PolicyID id;
  bool bVar5;
  MessageType t;
  char *__s;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  bVar5 = true;
  if (this->IsImportedTarget == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar2 = cmMakefile::GetPolicyStatus(context,CMP0026);
    if (PVar2 - NEW < 3) {
      t = FATAL_ERROR;
      __s = "may";
      bVar1 = false;
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x1a,id);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                            local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        bVar1 = false;
        __s = "should";
      }
      else {
        __s = (char *)0x0;
        bVar1 = true;
      }
      t = AUTHOR_WARNING;
    }
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The LOCATION property ",0x16);
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," not be read from target \"",0x1a);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                 ,0x7a);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(context,t,&local_1c8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return bVar5;
}

Assistant:

bool cmTarget::HandleLocationPropertyPolicy(cmMakefile* context) const
{
  if (this->IsImported())
    {
    return true;
    }
  std::ostringstream e;
  const char *modal = 0;
  cmake::MessageType messageType = cmake::AUTHOR_WARNING;
  switch (context->GetPolicyStatus(cmPolicies::CMP0026))
    {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = cmake::FATAL_ERROR;
    }

  if (modal)
    {
    e << "The LOCATION property " << modal << " not be read from target \""
      << this->GetName() << "\".  Use the target name directly with "
      "add_custom_command, or use the generator expression $<TARGET_FILE>, "
      "as appropriate.\n";
    context->IssueMessage(messageType, e.str());
    }

  return messageType != cmake::FATAL_ERROR;
}